

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O3

void duckdb::
     HistogramFunction<duckdb::DefaultMapType<std::map<short,unsigned_long,std::less<short>,std::allocator<std::pair<short_const,unsigned_long>>>>>
     ::
     Combine<duckdb::HistogramAggState<short,std::map<short,unsigned_long,std::less<short>,std::allocator<std::pair<short_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::map<short,unsigned_long,std::less<short>,std::allocator<std::pair<short_const,unsigned_long>>>>>>
               (HistogramAggState<short,_std::map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
                *source,HistogramAggState<short,_std::map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>_>
                        *target,AggregateInputData *input_data)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
  *pmVar3;
  mapped_type_conflict *pmVar4;
  _Base_ptr p_Var5;
  
  pmVar3 = source->hist;
  if (pmVar3 != (map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
                 *)0x0) {
    if (target->hist ==
        (map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
         *)0x0) {
      pmVar3 = (map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
                *)operator_new(0x30);
      p_Var1 = &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
      (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      *(undefined8 *)&(pmVar3->_M_t)._M_impl = 0;
      *(undefined8 *)&(pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      target->hist = pmVar3;
      pmVar3 = source->hist;
    }
    for (p_Var5 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
      p_Var2 = p_Var5[1]._M_parent;
      pmVar4 = ::std::
               map<short,_unsigned_long,_std::less<short>,_std::allocator<std::pair<const_short,_unsigned_long>_>_>
               ::operator[](target->hist,(key_type_conflict6 *)(p_Var5 + 1));
      *pmVar4 = (long)&p_Var2->_M_color + *pmVar4;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.hist) {
			return;
		}
		if (!target.hist) {
			target.hist = MAP_TYPE::CreateEmpty(input_data.allocator);
		}
		for (auto &entry : *source.hist) {
			(*target.hist)[entry.first] += entry.second;
		}
	}